

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::arraypool::poolinit(arraypool *this,int sizeofobject,int log2objperblk)

{
  int iVar1;
  
  if (sizeofobject < 2) {
    sizeofobject = 1;
  }
  this->objectbytes = sizeofobject;
  iVar1 = 1 << ((byte)log2objperblk & 0x1f);
  this->log2objectsperblock = log2objperblk;
  this->objectsperblock = iVar1;
  this->objectsperblockmark = iVar1 + -1;
  this->toparraylen = 0;
  this->toparray = (char **)0x0;
  this->objects = 0;
  this->totalmemory = 0;
  return;
}

Assistant:

void tetgenmesh::arraypool::poolinit(int sizeofobject, int log2objperblk)
{
  // Each object must be at least one byte long.
  objectbytes = sizeofobject > 1 ? sizeofobject : 1;

  log2objectsperblock = log2objperblk;
  // Compute the number of objects in each block.
  objectsperblock = ((int) 1) << log2objectsperblock;
  objectsperblockmark = objectsperblock - 1;

  // No memory has been allocated.
  totalmemory = 0l;
  // The top array has not been allocated yet.
  toparray = (char **) NULL;
  toparraylen = 0;

  // Ready all indices to be allocated.
  restart();
}